

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sip_decomposer.cc
# Opt level: O0

void anon_unknown.dwarf_ab538::find_removable_isolated_pattern_vertices
               (InputGraph *pattern,HomomorphismParams *params,
               set<int,_std::less<int>,_std::allocator<int>_> *isolated_pattern_vertices)

{
  bool bVar1;
  int iVar2;
  int *in_RDX;
  set<int,_std::less<int>,_std::allocator<int>_> *in_RSI;
  int i;
  int local_1c;
  
  if ((((((ulong)(in_RSI->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left & 1) == 0) &&
       (bVar1 = std::__cxx11::
                list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::empty((list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)(in_RSI + 3)), bVar1)) &&
      (bVar1 = std::__cxx11::
               list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::empty((list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)&in_RSI[3]._M_t._M_impl.super__Rb_tree_header._M_header._M_left), bVar1))
     && ((((bVar1 = std::unique_ptr::operator_cast_to_bool
                              ((unique_ptr<gss::innards::Lackey,_std::default_delete<gss::innards::Lackey>_>
                                *)0x155f0d), !bVar1 &&
           (bVar1 = InputGraph::has_vertex_labels((InputGraph *)0x155f1b), !bVar1)) &&
          ((((ulong)(in_RSI->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right & 1) == 0 ||
           (bVar1 = std::function::operator_cast_to_bool
                              ((function<bool_(const_std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>_&)>
                                *)0x155f38), !bVar1)))) &&
         (bVar1 = InputGraph::directed((InputGraph *)0x155f46), !bVar1)))) {
    for (local_1c = 0; iVar2 = InputGraph::size((InputGraph *)0x155f68), local_1c < iVar2;
        local_1c = local_1c + 1) {
      iVar2 = InputGraph::degree((InputGraph *)isolated_pattern_vertices,i);
      if (iVar2 == 0) {
        std::set<int,std::less<int>,std::allocator<int>>::emplace<int&>(in_RSI,in_RDX);
      }
    }
  }
  return;
}

Assistant:

auto find_removable_isolated_pattern_vertices(
        const InputGraph & pattern,
        const HomomorphismParams & params,
        set<int> & isolated_pattern_vertices) -> void
    {
        if (params.induced || (! params.pattern_less_constraints.empty()) || (! params.target_occur_less_constraints.empty()) || params.lackey || pattern.has_vertex_labels() || (params.count_solutions && params.enumerate_callback) || pattern.directed())
            return;

        for (int i = 0; i < pattern.size(); ++i)
            if (0 == pattern.degree(i))
                isolated_pattern_vertices.emplace(i);
    }